

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O3

CURLcode Curl_rtsp_parseheader(connectdata *conn,char *header)

{
  byte *__s1;
  Curl_easy *data;
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  CURLcode CVar5;
  byte *pbVar6;
  long CSeq;
  long local_30;
  
  data = conn->data;
  local_30 = 0;
  iVar2 = curl_strnequal("CSeq:",header,5);
  if (iVar2 == 0) {
    iVar2 = curl_strnequal("Session:",header,8);
    CVar5 = CURLE_OK;
    if (iVar2 != 0) {
      bVar1 = header[8];
      if (bVar1 != 0) {
        pbVar6 = (byte *)(header + 9);
        do {
          iVar2 = Curl_isspace((uint)bVar1);
          if (iVar2 == 0) {
            bVar1 = pbVar6[-1];
            if (bVar1 != 0) {
              __s1 = pbVar6 + -1;
              pcVar4 = (data->set).str[0x32];
              if (pcVar4 != (char *)0x0) {
                sVar3 = strlen(pcVar4);
                iVar2 = strncmp((char *)__s1,pcVar4,sVar3);
                if (iVar2 == 0) {
                  return CURLE_OK;
                }
                Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",__s1,pcVar4);
                return CURLE_RTSP_SESSION_ERROR;
              }
              sVar3 = 0;
              while (((bVar1 != 0 && (bVar1 != 0x3b)) &&
                     (iVar2 = Curl_isspace((uint)bVar1), iVar2 == 0))) {
                bVar1 = *pbVar6;
                sVar3 = sVar3 + 1;
                pbVar6 = pbVar6 + 1;
              }
              pcVar4 = (char *)(*Curl_cmalloc)(sVar3 + 1);
              (data->set).str[0x32] = pcVar4;
              if (pcVar4 != (char *)0x0) {
                memcpy(pcVar4,__s1,sVar3);
                (data->set).str[0x32][sVar3] = '\0';
                return CURLE_OK;
              }
              return CURLE_OUT_OF_MEMORY;
            }
            break;
          }
          bVar1 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        } while (bVar1 != 0);
      }
      CVar5 = CURLE_OK;
      Curl_failf(data,"Got a blank Session ID");
    }
  }
  else {
    CVar5 = CURLE_OK;
    iVar2 = __isoc99_sscanf(header + 4,": %ld",&local_30);
    if (iVar2 == 1) {
      *(long *)((long)(data->req).protop + 0x230) = local_30;
      (data->state).rtsp_CSeq_recv = local_30;
    }
    else {
      Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
      CVar5 = CURLE_RTSP_CSEQ_ERROR;
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct connectdata *conn,
                               char *header)
{
  struct Curl_easy *data = conn->data;
  long CSeq = 0;

  if(checkprefix("CSeq:", header)) {
    /* Store the received CSeq. Match is verified in rtsp_done */
    int nc = sscanf(&header[4], ": %ld", &CSeq);
    if(nc == 1) {
      struct RTSP *rtsp = data->req.protop;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    char *start;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISSPACE(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
    }
    else if(data->set.str[STRING_RTSP_SESSION_ID]) {
      /* If the Session ID is set, then compare */
      if(strncmp(start, data->set.str[STRING_RTSP_SESSION_ID],
                 strlen(data->set.str[STRING_RTSP_SESSION_ID]))  != 0) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       *
       * Allow any non whitespace content, up to the field separator or end of
       * line. RFC 2326 isn't 100% clear on the session ID and for example
       * gstreamer does url-encoded session ID's not covered by the standard.
       */
      char *end = start;
      while(*end && *end != ';' && !ISSPACE(*end))
        end++;

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = malloc(end - start + 1);
      if(data->set.str[STRING_RTSP_SESSION_ID] == NULL)
        return CURLE_OUT_OF_MEMORY;
      memcpy(data->set.str[STRING_RTSP_SESSION_ID], start, end - start);
      (data->set.str[STRING_RTSP_SESSION_ID])[end - start] = '\0';
    }
  }
  return CURLE_OK;
}